

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O3

int32 dumb_it_build_checkpoints(DUMB_IT_SIGDATA *sigdata,int startorder)

{
  int iVar1;
  IT_CALLBACKS *pIVar2;
  IT_CHECKPOINT *pIVar3;
  int32 iVar4;
  IT_CHECKPOINT *pIVar5;
  DUMB_IT_SIGRENDERER *src;
  IT_CHECKPOINT *pIVar6;
  
  if (sigdata != (DUMB_IT_SIGDATA *)0x0) {
    pIVar5 = sigdata->checkpoint;
    while (pIVar5 != (IT_CHECKPOINT *)0x0) {
      pIVar6 = pIVar5->next;
      _dumb_it_end_sigrenderer(pIVar5->sigrenderer);
      free(pIVar5);
      pIVar5 = pIVar6;
    }
    sigdata->checkpoint = (IT_CHECKPOINT *)0x0;
    pIVar5 = (IT_CHECKPOINT *)malloc(0x18);
    if (pIVar5 != (IT_CHECKPOINT *)0x0) {
      pIVar5->time = 0;
      src = dumb_it_init_sigrenderer(sigdata,0,startorder);
      pIVar5->sigrenderer = src;
      if (src == (DUMB_IT_SIGRENDERER *)0x0) {
        free(pIVar5);
      }
      else {
        pIVar2 = src->callbacks;
        pIVar2->loop = dumb_it_callback_terminate;
        pIVar2->xm_speed_zero = dumb_it_callback_terminate;
        pIVar2->global_volume_zero = dumb_it_callback_terminate;
        pIVar6 = sigdata->checkpoint;
        while (pIVar6 != (IT_CHECKPOINT *)0x0) {
          pIVar3 = pIVar6->next;
          _dumb_it_end_sigrenderer(pIVar6->sigrenderer);
          free(pIVar6);
          pIVar6 = pIVar3;
        }
        sigdata->checkpoint = pIVar5;
        do {
          src = dup_sigrenderer(src,0,src->callbacks);
          pIVar5->sigrenderer->callbacks = (IT_CALLBACKS *)0x0;
          if (src == (DUMB_IT_SIGRENDERER *)0x0) {
            pIVar5->next = (IT_CHECKPOINT *)0x0;
            return pIVar5->time;
          }
          iVar4 = it_sigrenderer_get_samples(src,0.0,1.0,0x1e0000,(sample_t_conflict **)0x0);
          if (iVar4 < 0x1e0000) {
            _dumb_it_end_sigrenderer(src);
            pIVar5->next = (IT_CHECKPOINT *)0x0;
LAB_005b007e:
            return iVar4 + pIVar5->time;
          }
          pIVar6 = (IT_CHECKPOINT *)malloc(0x18);
          pIVar5->next = pIVar6;
          if (pIVar6 == (IT_CHECKPOINT *)0x0) {
            _dumb_it_end_sigrenderer(src);
            iVar4 = 0x1e0000;
            goto LAB_005b007e;
          }
          iVar1 = pIVar5->time;
          pIVar6->time = iVar1 + 0x1e0000;
          pIVar6->sigrenderer = src;
          pIVar5 = pIVar6;
        } while (iVar1 < 0x1c020000);
        pIVar6->next = (IT_CHECKPOINT *)0x0;
      }
    }
  }
  return 0;
}

Assistant:

int32 DUMBEXPORT dumb_it_build_checkpoints(DUMB_IT_SIGDATA *sigdata, int startorder)
{
	IT_CHECKPOINT *checkpoint;
	if (!sigdata) return 0;
	checkpoint = sigdata->checkpoint;
	while (checkpoint) {
		IT_CHECKPOINT *next = checkpoint->next;
		_dumb_it_end_sigrenderer(checkpoint->sigrenderer);
		free(checkpoint);
		checkpoint = next;
	}
	sigdata->checkpoint = NULL;
	checkpoint = malloc(sizeof(*checkpoint));
	if (!checkpoint) return 0;
	checkpoint->time = 0;
	checkpoint->sigrenderer = dumb_it_init_sigrenderer(sigdata, 0, startorder);
	if (!checkpoint->sigrenderer) {
		free(checkpoint);
		return 0;
	}
	checkpoint->sigrenderer->callbacks->loop = &dumb_it_callback_terminate;
	checkpoint->sigrenderer->callbacks->xm_speed_zero = &dumb_it_callback_terminate;
	checkpoint->sigrenderer->callbacks->global_volume_zero = &dumb_it_callback_terminate;

	if (sigdata->checkpoint)
	{
		IT_CHECKPOINT *checkpoint = sigdata->checkpoint;
		while (checkpoint) {
			IT_CHECKPOINT *next = checkpoint->next;
			_dumb_it_end_sigrenderer(checkpoint->sigrenderer);
			free(checkpoint);
			checkpoint = next;
		}
	}

	sigdata->checkpoint = checkpoint;

	for (;;) {
		int32 l;
		DUMB_IT_SIGRENDERER *sigrenderer = dup_sigrenderer(checkpoint->sigrenderer, 0, checkpoint->sigrenderer->callbacks);
		checkpoint->sigrenderer->callbacks = NULL;
		if (!sigrenderer) {
			checkpoint->next = NULL;
			return checkpoint->time;
		}

		l = it_sigrenderer_get_samples(sigrenderer, 0, 1.0f, IT_CHECKPOINT_INTERVAL, NULL);
		if (l < IT_CHECKPOINT_INTERVAL) {
			_dumb_it_end_sigrenderer(sigrenderer);
			checkpoint->next = NULL;
			return checkpoint->time + l;
		}

		checkpoint->next = malloc(sizeof(*checkpoint->next));
		if (!checkpoint->next) {
			_dumb_it_end_sigrenderer(sigrenderer);
			return checkpoint->time + IT_CHECKPOINT_INTERVAL;
		}

		checkpoint->next->time = checkpoint->time + IT_CHECKPOINT_INTERVAL;
		checkpoint = checkpoint->next;
		checkpoint->sigrenderer = sigrenderer;

		if (checkpoint->time >= FUCKIT_THRESHOLD) {
			checkpoint->next = NULL;
			return 0;
		}
	}
}